

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCongruenceClosure.cpp
# Opt level: O2

string * __thiscall
DP::SimpleCongruenceClosure::CEq::toString_abi_cxx11_
          (string *__return_storage_ptr__,CEq *this,SimpleCongruenceClosure *parent)

{
  ostream *poVar1;
  ostringstream res;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  poVar1 = std::operator<<(poVar1,"=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," implied by ");
  if (this->foOrigin == true) {
    if (this->foPremise == (Literal *)0x0) {
      std::operator<<((ostream *)local_1a0,"built-in true!=false");
    }
    else {
      Kernel::operator<<((ostream *)local_1a0,this->foPremise);
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)local_1a0,"congruence of (");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,") and (");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,")");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string SimpleCongruenceClosure::CEq::toString(SimpleCongruenceClosure& parent) const
{
  std::ostringstream res;
  res << c1<<"="<<c2<<" implied by ";
  if(foOrigin) {
    if(foPremise) {
      res << (*foPremise);
    }
    else {
      res << "built-in true!=false";
    }
  }
  else {
    CPair p1= parent._cInfos[c1].namedPair;
    CPair p2= parent._cInfos[c2].namedPair;
    res << "congruence of ("<<p1.first<<","<<p1.second<<") and ("<<p2.first<<","<<p2.second<<")";
  }
  return res.str();
}